

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  uint uVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  pGVar3 = Gia_ManAppendObj(p);
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit0 < 0) {
LAB_006ee03d:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar6 = (uint)iLit0 >> 1;
  uVar1 = p->nObjs;
  if ((int)uVar1 <= (int)uVar6) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit1 < 0) goto LAB_006ee03d;
  uVar4 = (uint)iLit1 >> 1;
  if (uVar1 <= uVar4) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c7,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 0) goto LAB_006ee03d;
  uVar9 = (uint)iLitC >> 1;
  if (uVar1 <= uVar9) {
    __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c8,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar6 == uVar4) {
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2c9,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar9 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ca,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar9 == uVar4) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2cb,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  uVar9 = iLit1 & 1;
  if ((uVar9 != 0) && (p->pHTable != (int *)0x0)) {
    __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2cc,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  pGVar5 = p->pObjs;
  iVar7 = (int)pGVar3;
  if (uVar6 < uVar4) {
    if (pGVar5 + uVar1 <= pGVar3 || pGVar3 < pGVar5) goto LAB_006ee01e;
    uVar2 = *(ulong *)pGVar3;
    uVar8 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar7 - (int)pGVar5) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    *(ulong *)pGVar3 = uVar8 | uVar2 & 0xffffffffc0000000;
    pGVar5 = p->pObjs;
    if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_006ee01e;
    *(ulong *)pGVar3 =
         (ulong)uVar9 << 0x3d |
         uVar8 | uVar2 & 0xc0000000c0000000 |
         (ulong)(((uint)(iVar7 - (int)pGVar5) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) << 0x20;
    pGVar5 = p->pObjs;
    if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_006ee01e;
  }
  else {
    if (pGVar5 + uVar1 <= pGVar3 || pGVar3 < pGVar5) goto LAB_006ee01e;
    uVar2 = *(ulong *)pGVar3;
    uVar8 = (ulong)(((uint)(iVar7 - (int)pGVar5) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) << 0x20;
    uVar10 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pGVar3 = uVar10 | uVar2 & 0xc0000000ffffffff | uVar8;
    pGVar5 = p->pObjs;
    if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_006ee01e;
    *(ulong *)pGVar3 =
         (ulong)(uVar9 << 0x1d) | uVar10 | uVar2 & 0xc0000000c0000000 | uVar8 |
         (ulong)(((uint)(iVar7 - (int)pGVar5) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
    pGVar5 = p->pObjs;
    if ((pGVar3 < pGVar5) || (pGVar5 + p->nObjs <= pGVar3)) goto LAB_006ee01e;
    iLitC = iLitC ^ 1;
  }
  iVar7 = (int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2);
  p->pMuxes[iVar7 * -0x55555555] = iLitC;
  p->nMuxes = p->nMuxes + 1;
  if (pGVar3 < pGVar5 + p->nObjs) {
    return iVar7 * 0x55555556;
  }
LAB_006ee01e:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( p->pMuxes != NULL );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1) );
    assert( !p->pHTable || !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) < Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl0 = Abc_LitIsCompl(iLit0);
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl1 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = iLitC;
    }
    else
    {
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl1 = Abc_LitIsCompl(iLit0);
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl0 = Abc_LitIsCompl(iLit1);
        p->pMuxes[Gia_ObjId(p, pObj)] = Abc_LitNot(iLitC);
    }
    p->nMuxes++;
    return Gia_ObjId( p, pObj ) << 1;
}